

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O0

void duckdb::TestDeleteFile(string *path)

{
  byte bVar1;
  pointer pFVar2;
  undefined8 in_RDI;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> fs;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  optional_ptr<duckdb::FileOpener,_true> local_30;
  optional_ptr<duckdb::FileOpener,_true> local_28 [5];
  
  duckdb::FileSystem::CreateLocal();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  optional_ptr<duckdb::FileOpener,_true>::optional_ptr(local_28,(FileOpener *)0x0);
  bVar1 = (**(code **)(*(long *)pFVar2 + 0x90))(pFVar2,in_RDI,local_28[0].ptr);
  if ((bVar1 & 1) != 0) {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)CONCAT17(bVar1,in_stack_ffffffffffffffb0));
    optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_30,(FileOpener *)0x0);
    (**(code **)(*(long *)pFVar2 + 0xa0))(pFVar2,in_RDI,local_30.ptr);
  }
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
             0x7f2422);
  return;
}

Assistant:

void TestDeleteFile(string path) {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	try {
		if (fs->FileExists(path)) {
			fs->RemoveFile(path);
		}
	} catch (...) {
	}
}